

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O0

void rec_do(Curl_easy *data,int option)

{
  TELNET *pTVar1;
  TELNET *tn;
  int option_local;
  Curl_easy *data_local;
  
  pTVar1 = (data->req).p.telnet;
  switch(pTVar1->us[option]) {
  case 0:
    if (pTVar1->us_preferred[option] == 1) {
      pTVar1->us[option] = 1;
      send_negotiation(data,0xfb,option);
      if (pTVar1->subnegotiation[option] == 1) {
        sendsuboption(data,option);
      }
    }
    else if (pTVar1->subnegotiation[option] == 1) {
      pTVar1->us[option] = 1;
      send_negotiation(data,0xfb,option);
      sendsuboption(data,option);
    }
    else {
      send_negotiation(data,0xfc,option);
    }
    break;
  case 1:
    break;
  case 2:
    if (pTVar1->usq[option] == 0) {
      pTVar1->us[option] = 1;
      if (pTVar1->subnegotiation[option] == 1) {
        sendsuboption(data,option);
      }
    }
    else if (pTVar1->usq[option] == 1) {
      pTVar1->us[option] = 3;
      pTVar1->himq[option] = 0;
      send_negotiation(data,0xfc,option);
    }
    break;
  case 3:
    if (pTVar1->usq[option] == 0) {
      pTVar1->us[option] = 0;
    }
    else if (pTVar1->usq[option] == 1) {
      pTVar1->us[option] = 1;
      pTVar1->usq[option] = 0;
    }
  }
  return;
}

Assistant:

static
void rec_do(struct Curl_easy *data, int option)
{
  struct TELNET *tn = data->req.p.telnet;
  switch(tn->us[option]) {
  case CURL_NO:
    if(tn->us_preferred[option] == CURL_YES) {
      tn->us[option] = CURL_YES;
      send_negotiation(data, CURL_WILL, option);
      if(tn->subnegotiation[option] == CURL_YES)
        /* transmission of data option */
        sendsuboption(data, option);
    }
    else if(tn->subnegotiation[option] == CURL_YES) {
      /* send information to achieve this option */
      tn->us[option] = CURL_YES;
      send_negotiation(data, CURL_WILL, option);
      sendsuboption(data, option);
    }
    else
      send_negotiation(data, CURL_WONT, option);
    break;

  case CURL_YES:
    /* Already enabled */
    break;

  case CURL_WANTNO:
    switch(tn->usq[option]) {
    case CURL_EMPTY:
      /* Error: DONT answered by WILL */
      tn->us[option] = CURL_NO;
      break;
    case CURL_OPPOSITE:
      /* Error: DONT answered by WILL */
      tn->us[option] = CURL_YES;
      tn->usq[option] = CURL_EMPTY;
      break;
    }
    break;

  case CURL_WANTYES:
    switch(tn->usq[option]) {
    case CURL_EMPTY:
      tn->us[option] = CURL_YES;
      if(tn->subnegotiation[option] == CURL_YES) {
        /* transmission of data option */
        sendsuboption(data, option);
      }
      break;
    case CURL_OPPOSITE:
      tn->us[option] = CURL_WANTNO;
      tn->himq[option] = CURL_EMPTY;
      send_negotiation(data, CURL_WONT, option);
      break;
    }
    break;
  }
}